

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_setenv(LIBSSH2_CHANNEL *channel,char *varname,uint varname_len,char *value,
                  uint value_len)

{
  int iVar1;
  uchar *puVar2;
  size_t sStack_58;
  int rc;
  size_t data_len;
  uchar *data;
  uchar *s;
  LIBSSH2_SESSION *session;
  char *pcStack_30;
  uint value_len_local;
  char *value_local;
  char *pcStack_20;
  uint varname_len_local;
  char *varname_local;
  LIBSSH2_CHANNEL *channel_local;
  
  s = (uchar *)channel->session;
  session._4_4_ = value_len;
  pcStack_30 = value;
  value_local._4_4_ = varname_len;
  pcStack_20 = varname;
  varname_local = (char *)channel;
  if (channel->setenv_state == libssh2_NB_state_idle) {
    channel->setenv_packet_len = (ulong)(varname_len + value_len + 0x15);
    memset(&channel->setenv_packet_requirev_state,0,8);
    puVar2 = (uchar *)(**(code **)(s + 8))(*(undefined8 *)(varname_local + 0x98),s);
    *(uchar **)(varname_local + 0x90) = puVar2;
    if (*(long *)(varname_local + 0x90) == 0) {
      data = puVar2;
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)s,-6,"Unable to allocate memory for setenv packet");
      return iVar1;
    }
    data = puVar2 + 1;
    *puVar2 = 'b';
    _libssh2_store_u32(&data,*(uint32_t *)(varname_local + 0x4c));
    _libssh2_store_str(&data,"env",3);
    *data = '\x01';
    data = data + 1;
    _libssh2_store_str(&data,pcStack_20,(ulong)value_local._4_4_);
    _libssh2_store_str(&data,pcStack_30,(ulong)session._4_4_);
    varname_local[0x88] = '\x02';
    varname_local[0x89] = '\0';
    varname_local[0x8a] = '\0';
    varname_local[0x8b] = '\0';
  }
  if (*(int *)(varname_local + 0x88) == 2) {
    iVar1 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)s,*(uchar **)(varname_local + 0x90),
                       *(size_t *)(varname_local + 0x98),(uchar *)0x0,0);
    if (iVar1 == -0x25) {
      _libssh2_error((LIBSSH2_SESSION *)s,-0x25,"Would block sending setenv request");
      return -0x25;
    }
    if (iVar1 != 0) {
      (**(code **)(s + 0x18))(*(undefined8 *)(varname_local + 0x90),s);
      varname_local[0x90] = '\0';
      varname_local[0x91] = '\0';
      varname_local[0x92] = '\0';
      varname_local[0x93] = '\0';
      varname_local[0x94] = '\0';
      varname_local[0x95] = '\0';
      varname_local[0x96] = '\0';
      varname_local[0x97] = '\0';
      varname_local[0x88] = '\0';
      varname_local[0x89] = '\0';
      varname_local[0x8a] = '\0';
      varname_local[0x8b] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)s,-7,
                             "Unable to send channel-request packet for setenv request");
      return iVar1;
    }
    (**(code **)(s + 0x18))(*(undefined8 *)(varname_local + 0x90),s);
    varname_local[0x90] = '\0';
    varname_local[0x91] = '\0';
    varname_local[0x92] = '\0';
    varname_local[0x93] = '\0';
    varname_local[0x94] = '\0';
    varname_local[0x95] = '\0';
    varname_local[0x96] = '\0';
    varname_local[0x97] = '\0';
    _libssh2_htonu32((uchar *)(varname_local + 0xa0),*(uint32_t *)(varname_local + 0x38));
    varname_local[0x88] = '\x03';
    varname_local[0x89] = '\0';
    varname_local[0x8a] = '\0';
    varname_local[0x8b] = '\0';
  }
  if (*(int *)(varname_local + 0x88) == 3) {
    iVar1 = _libssh2_packet_requirev
                      ((LIBSSH2_SESSION *)s,"cd",(uchar **)&data_len,&stack0xffffffffffffffa8,1,
                       (uchar *)(varname_local + 0xa0),4,
                       (packet_requirev_state_t *)(varname_local + 0xa8));
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) {
      varname_local[0x88] = '\0';
      varname_local[0x89] = '\0';
      varname_local[0x8a] = '\0';
      varname_local[0x8b] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)s,iVar1,"Failed getting response for channel-setenv"
                            );
      return iVar1;
    }
    if (sStack_58 == 0) {
      varname_local[0x88] = '\0';
      varname_local[0x89] = '\0';
      varname_local[0x8a] = '\0';
      varname_local[0x8b] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)s,-0xe,"Unexpected packet size");
      return iVar1;
    }
    if (*(char *)data_len == 'c') {
      (**(code **)(s + 0x18))(data_len,s);
      varname_local[0x88] = '\0';
      varname_local[0x89] = '\0';
      varname_local[0x8a] = '\0';
      varname_local[0x8b] = '\0';
      return 0;
    }
    (**(code **)(s + 0x18))(data_len,s);
  }
  varname_local[0x88] = '\0';
  varname_local[0x89] = '\0';
  varname_local[0x8a] = '\0';
  varname_local[0x8b] = '\0';
  iVar1 = _libssh2_error((LIBSSH2_SESSION *)s,-0x16,"Unable to complete request for channel-setenv")
  ;
  return iVar1;
}

Assistant:

static int channel_setenv(LIBSSH2_CHANNEL *channel,
                          const char *varname, unsigned int varname_len,
                          const char *value, unsigned int value_len)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char *s, *data;
    static const unsigned char reply_codes[3] =
        { SSH_MSG_CHANNEL_SUCCESS, SSH_MSG_CHANNEL_FAILURE, 0 };
    size_t data_len;
    int rc;

    if(channel->setenv_state == libssh2_NB_state_idle) {
        /* 21 = packet_type(1) + channel_id(4) + request_len(4) +
         * request(3)"env" + want_reply(1) + varname_len(4) + value_len(4) */
        channel->setenv_packet_len = varname_len + value_len + 21;

        /* Zero the whole thing out */
        memset(&channel->setenv_packet_requirev_state, 0,
               sizeof(channel->setenv_packet_requirev_state));

        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Setting remote environment variable: %s=%s on "
                       "channel %u/%u",
                       varname, value, channel->local.id, channel->remote.id));

        s = channel->setenv_packet =
            LIBSSH2_ALLOC(session, channel->setenv_packet_len);
        if(!channel->setenv_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory "
                                  "for setenv packet");
        }

        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, "env", sizeof("env") - 1);
        *(s++) = 0x01;
        _libssh2_store_str(&s, varname, varname_len);
        _libssh2_store_str(&s, value, value_len);

        channel->setenv_state = libssh2_NB_state_created;
    }

    if(channel->setenv_state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session,
                                     channel->setenv_packet,
                                     channel->setenv_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc,
                           "Would block sending setenv request");
            return rc;
        }
        else if(rc) {
            LIBSSH2_FREE(session, channel->setenv_packet);
            channel->setenv_packet = NULL;
            channel->setenv_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send channel-request packet for "
                                  "setenv request");
        }
        LIBSSH2_FREE(session, channel->setenv_packet);
        channel->setenv_packet = NULL;

        _libssh2_htonu32(channel->setenv_local_channel, channel->local.id);

        channel->setenv_state = libssh2_NB_state_sent;
    }

    if(channel->setenv_state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_requirev(session, reply_codes, &data, &data_len,
                                      1, channel->setenv_local_channel, 4,
                                      &channel->
                                      setenv_packet_requirev_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        if(rc) {
            channel->setenv_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "Failed getting response for "
                                  "channel-setenv");
        }
        else if(data_len < 1) {
            channel->setenv_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                  "Unexpected packet size");
        }

        if(data[0] == SSH_MSG_CHANNEL_SUCCESS) {
            LIBSSH2_FREE(session, data);
            channel->setenv_state = libssh2_NB_state_idle;
            return 0;
        }

        LIBSSH2_FREE(session, data);
    }

    channel->setenv_state = libssh2_NB_state_idle;
    return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_REQUEST_DENIED,
                          "Unable to complete request for channel-setenv");
}